

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary_executor.hpp
# Opt level: O3

idx_t duckdb::BinaryExecutor::SelectGenericLoopSwitch<signed_char,signed_char,duckdb::GreaterThan>
                (char *ldata,char *rdata,SelectionVector *lsel,SelectionVector *rsel,
                SelectionVector *result_sel,idx_t count,ValidityMask *lvalidity,
                ValidityMask *rvalidity,SelectionVector *true_sel,SelectionVector *false_sel)

{
  sel_t *psVar1;
  sel_t *psVar2;
  sel_t *psVar3;
  idx_t iVar4;
  idx_t iVar5;
  long lVar6;
  idx_t iVar7;
  ulong uVar8;
  ulong uVar9;
  SelectionVector *pSVar10;
  idx_t iVar11;
  idx_t iVar12;
  ulong uVar13;
  idx_t iVar14;
  ulong uVar15;
  
  if ((rvalidity->super_TemplatedValidityMask<unsigned_long>).validity_mask != (unsigned_long *)0x0
      || (lvalidity->super_TemplatedValidityMask<unsigned_long>).validity_mask !=
         (unsigned_long *)0x0) {
    iVar5 = SelectGenericLoopSelSwitch<signed_char,signed_char,duckdb::GreaterThan,false>
                      (ldata,rdata,lsel,rsel,result_sel,count,lvalidity,rvalidity,true_sel,false_sel
                      );
    return iVar5;
  }
  if (false_sel == (SelectionVector *)0x0 || true_sel == (SelectionVector *)0x0) {
    if (true_sel == (SelectionVector *)0x0) {
      if (count == 0) {
        lVar6 = 0;
      }
      else {
        psVar1 = result_sel->sel_vector;
        psVar2 = lsel->sel_vector;
        psVar3 = rsel->sel_vector;
        lVar6 = 0;
        uVar9 = 0;
        do {
          uVar8 = uVar9;
          if (psVar1 != (sel_t *)0x0) {
            uVar8 = (ulong)psVar1[uVar9];
          }
          uVar13 = uVar9;
          if (psVar2 != (sel_t *)0x0) {
            uVar13 = (ulong)psVar2[uVar9];
          }
          uVar15 = uVar9;
          if (psVar3 != (sel_t *)0x0) {
            uVar15 = (ulong)psVar3[uVar9];
          }
          if (ldata[uVar13] <= rdata[uVar15]) {
            false_sel->sel_vector[lVar6] = (sel_t)uVar8;
            lVar6 = lVar6 + 1;
          }
          uVar9 = uVar9 + 1;
        } while (count != uVar9);
      }
      return count - lVar6;
    }
    if (count != 0) {
      psVar1 = result_sel->sel_vector;
      psVar2 = lsel->sel_vector;
      psVar3 = rsel->sel_vector;
      iVar5 = 0;
      uVar9 = 0;
      do {
        uVar8 = uVar9;
        if (psVar1 != (sel_t *)0x0) {
          uVar8 = (ulong)psVar1[uVar9];
        }
        uVar13 = uVar9;
        if (psVar2 != (sel_t *)0x0) {
          uVar13 = (ulong)psVar2[uVar9];
        }
        uVar15 = uVar9;
        if (psVar3 != (sel_t *)0x0) {
          uVar15 = (ulong)psVar3[uVar9];
        }
        if (rdata[uVar15] < ldata[uVar13]) {
          true_sel->sel_vector[iVar5] = (sel_t)uVar8;
          iVar5 = iVar5 + 1;
        }
        uVar9 = uVar9 + 1;
      } while (count != uVar9);
      return iVar5;
    }
  }
  else if (count != 0) {
    psVar1 = result_sel->sel_vector;
    psVar2 = lsel->sel_vector;
    psVar3 = rsel->sel_vector;
    iVar7 = 0;
    iVar5 = 0;
    iVar11 = 0;
    do {
      iVar14 = iVar7;
      if (psVar1 != (sel_t *)0x0) {
        iVar14 = (idx_t)psVar1[iVar7];
      }
      iVar4 = iVar7;
      if (psVar2 != (sel_t *)0x0) {
        iVar4 = (idx_t)psVar2[iVar7];
      }
      iVar12 = iVar7;
      if (psVar3 != (sel_t *)0x0) {
        iVar12 = (idx_t)psVar3[iVar7];
      }
      if (rdata[iVar12] < ldata[iVar4]) {
        iVar4 = iVar5 + 1;
        pSVar10 = true_sel;
        iVar12 = iVar11;
      }
      else {
        iVar12 = iVar11 + 1;
        iVar4 = iVar5;
        iVar5 = iVar11;
        pSVar10 = false_sel;
      }
      pSVar10->sel_vector[iVar5] = (sel_t)iVar14;
      iVar7 = iVar7 + 1;
      iVar5 = iVar4;
      iVar11 = iVar12;
    } while (count != iVar7);
    return iVar4;
  }
  return 0;
}

Assistant:

static inline idx_t
	SelectGenericLoopSwitch(const LEFT_TYPE *__restrict ldata, const RIGHT_TYPE *__restrict rdata,
	                        const SelectionVector *__restrict lsel, const SelectionVector *__restrict rsel,
	                        const SelectionVector *__restrict result_sel, idx_t count, ValidityMask &lvalidity,
	                        ValidityMask &rvalidity, SelectionVector *true_sel, SelectionVector *false_sel) {
#ifndef DUCKDB_SMALLER_BINARY
		if (!lvalidity.AllValid() || !rvalidity.AllValid()) {
			return SelectGenericLoopSelSwitch<LEFT_TYPE, RIGHT_TYPE, OP, false>(
			    ldata, rdata, lsel, rsel, result_sel, count, lvalidity, rvalidity, true_sel, false_sel);
		} else {
			return SelectGenericLoopSelSwitch<LEFT_TYPE, RIGHT_TYPE, OP, true>(
			    ldata, rdata, lsel, rsel, result_sel, count, lvalidity, rvalidity, true_sel, false_sel);
		}
#else
		return SelectGenericLoop<LEFT_TYPE, RIGHT_TYPE, OP>(ldata, rdata, lsel, rsel, result_sel, count, lvalidity,
		                                                    rvalidity, true_sel, false_sel);
#endif
	}